

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascr.c
# Opt level: O0

void ascr_report(ascr_t *a)

{
  ascr_t *a_local;
  
  err_msg(ERR_INFO,(char *)0x0,0,"Initialization of ascr_t, report:\n");
  err_msg(ERR_INFO,(char *)0x0,0,"No. of CI senone =%d \n",(ulong)(uint)a->n_cisen);
  err_msg(ERR_INFO,(char *)0x0,0,"No. of senone = %d\n",(ulong)(uint)a->n_sen);
  err_msg(ERR_INFO,(char *)0x0,0,"No. of composite senone = %d\n",(ulong)(uint)a->n_comsen);
  err_msg(ERR_INFO,(char *)0x0,0,"No. of senone sequence = %d\n",(ulong)(uint)a->n_sseq);
  err_msg(ERR_INFO,(char *)0x0,0,"No. of composite senone sequence=%d \n",(ulong)(uint)a->n_comsseq)
  ;
  err_msg(ERR_INFO,(char *)0x0,0,"Parameters used in phoneme lookahead:\n");
  err_msg(ERR_INFO,(char *)0x0,0,"Phoneme lookahead window = %d\n",(ulong)(uint)a->pl_win);
  err_msg(ERR_INFO,(char *)0x0,0,"\n");
  return;
}

Assistant:

void
ascr_report(ascr_t * a)
{
    E_INFO_NOFN("Initialization of ascr_t, report:\n");
    E_INFO_NOFN("No. of CI senone =%d \n", a->n_cisen);
    E_INFO_NOFN("No. of senone = %d\n", a->n_sen);
    E_INFO_NOFN("No. of composite senone = %d\n", a->n_comsen);
    E_INFO_NOFN("No. of senone sequence = %d\n", a->n_sseq);
    E_INFO_NOFN("No. of composite senone sequence=%d \n", a->n_comsseq);
    E_INFO_NOFN("Parameters used in phoneme lookahead:\n");
    E_INFO_NOFN("Phoneme lookahead window = %d\n", a->pl_win);
    E_INFO_NOFN("\n");
}